

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * __thiscall
Pathie::Path::burst(vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,
                   Path *this,bool descend)

{
  char *pcVar1;
  long lVar2;
  string local_1f0 [32];
  Path local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  Path local_190;
  string local_170 [8];
  string lastcomponent;
  string local_150 [32];
  Path local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  Path local_f0;
  string local_d0 [8];
  string component;
  allocator local_a9;
  string local_a8 [32];
  Path local_88;
  string local_58 [8];
  string prefix;
  size_t lastpos;
  size_t pos;
  bool descend_local;
  Path *this_local;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *results;
  
  std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::vector(__return_storage_ptr__);
  std::__cxx11::string::string(local_58);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this);
  if (*pcVar1 == '/') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"/",&local_a9);
    Path(&local_88,(string *)local_a8);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_88);
    ~Path(&local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::append((char *)local_58);
  }
  while (lVar2 = std::__cxx11::string::find((char *)this,0x11817c), lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_d0,(ulong)this);
    if (descend) {
      std::operator+(local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      Path(&local_f0,local_110);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
                (__return_storage_ptr__,&local_f0);
      ~Path(&local_f0);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::append(local_58);
      std::__cxx11::string::append((char *)local_58);
    }
    else {
      std::__cxx11::string::string(local_150,local_d0);
      Path(&local_130,(string *)local_150);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
                (__return_storage_ptr__,&local_130);
      ~Path(&local_130);
      std::__cxx11::string::~string(local_150);
    }
    std::__cxx11::string::~string(local_d0);
  }
  std::__cxx11::string::substr((ulong)local_170,(ulong)this);
  if (descend) {
    std::operator+(local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    Path(&local_190,local_1b0);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_190);
    ~Path(&local_190);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  else {
    std::__cxx11::string::string(local_1f0,local_170);
    Path(&local_1d0,(string *)local_1f0);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_1d0);
    ~Path(&local_1d0);
    std::__cxx11::string::~string(local_1f0);
  }
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Path> Path::burst(bool descend /* = false */) const
{
  size_t pos = 0;
  size_t lastpos = 0;
  std::vector<Path> results;
  std::string prefix;

  // Take care of leading / of absolute paths
  if (m_path[0] == '/') {
    results.push_back(Path("/"));
    prefix.append("/");

    // Adjust pos so we don’t find the initial /
    pos++;
    lastpos++;
  }

  while((pos = m_path.find("/", pos)) != string::npos) {
    std::string component = m_path.substr(lastpos, pos - lastpos);

    if (descend) {
      results.push_back(Path(prefix + component));
      prefix.append(component);
      prefix.append("/");
    }
    else {
      results.push_back(Path(component));
    }

    lastpos = pos + 1;
    pos++;
  }

  std::string lastcomponent = m_path.substr(lastpos);

  if (descend)
    results.push_back(Path(prefix + lastcomponent)); // Note no trailing /
  else
    results.push_back(Path(lastcomponent));

  return results;
}